

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O2

bool __thiscall
midi_processor::process_riff_midi_count
          (midi_processor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,
          size_t *track_count)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  size_t *extraout_RDX;
  uchar *puVar4;
  ulong uVar5;
  const_iterator it1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar2 = *(long *)this;
  puVar4 = (uchar *)(lVar2 + (ulong)*(uint *)(lVar2 + 4) + 8);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (it1._M_current = (uchar *)(lVar2 + 0xc);
      (it1._M_current != puVar4 && (7 < (long)puVar4 - (long)it1._M_current));
      it1._M_current = it1._M_current + uVar5 + (it1._M_current + uVar5 != puVar4 & bVar1)) {
    bVar1 = it1._M_current[4];
    uVar5 = (ulong)((uint)*(ushort *)(it1._M_current + 6) << 0x10 | (uint)it1._M_current[5] << 8 |
                   (uint)bVar1);
    if ((ulong)((long)puVar4 - (long)it1._M_current) < uVar5) break;
    bVar3 = it_equal(it1,"data",(size_t)track_count);
    if (bVar3) {
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,it1._M_current + 8
                 ,it1._M_current + uVar5 + 8);
      bVar3 = process_standard_midi_count
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                         (size_t *)p_file);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
      goto LAB_0010e329;
    }
    track_count = extraout_RDX;
  }
  bVar3 = false;
LAB_0010e329:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return bVar3;
}

Assistant:

bool midi_processor::process_riff_midi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal(it, "data", 4) )
        {
            std::vector<uint8_t> midi_file;
            midi_file.assign( it + 8, it + 8 + chunk_size );
            return process_standard_midi_count( midi_file, track_count );
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
    }

    return false;
}